

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O3

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenMethod_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,Type *type)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = *(int *)&(this->super_BaseGenerator)._vptr_BaseGenerator;
  if (iVar1 - 1U < 0xc) {
    ToSignedType_abi_cxx11_(__return_storage_ptr__,this,type);
  }
  else {
    if (iVar1 == 0xf) {
      pcVar2 = "Offset";
      if (*(char *)&(((this->super_BaseGenerator).parser_)->enums_).dict._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_right != '\0') {
        pcVar2 = "Struct";
      }
    }
    else {
      pcVar2 = "Offset";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + 6);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenMethod(const Type &type) {
    return IsScalar(type.base_type) ? ToSignedType(type)
                                    : (IsStruct(type) ? "Struct" : "Offset");
  }